

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

decimal_fp<double> fmt::v11::detail::dragonbox::to_decimal<double>(double x)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  compute_mul_parity_result cVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  decimal_fp<double> dVar17;
  cache_entry_type cache;
  uint128_fallback local_40;
  
  uVar11 = (ulong)x & 0xfffffffffffff;
  uVar12 = (uint)((ulong)x >> 0x34) & 0x7ff;
  if (uVar12 == 0) {
    iVar13 = -0x432;
    if (uVar11 == 0) {
      uVar10 = 0;
      iVar9 = 0;
      goto LAB_001da890;
    }
  }
  else {
    iVar13 = uVar12 - 0x433;
    if (uVar11 == 0) {
      dVar17 = shorter_interval_case<double>(iVar13);
      uVar10 = dVar17.significand;
      iVar9 = dVar17.exponent;
      goto LAB_001da890;
    }
    uVar11 = uVar11 + 0x10000000000000;
  }
  iVar9 = iVar13 * 0x4d105 >> 0x14;
  local_40 = cache_accessor<double>::get_cached_power(2 - iVar9);
  iVar13 = ((2 - iVar9) * 0x1a934f >> 0x13) + iVar13;
  uVar10 = uVar11 * 2 + 1 << ((byte)iVar13 & 0x3f);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar10;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_40.hi_;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar10;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_40.lo_;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = SUB168(auVar2 * auVar6,8);
  auVar7 = auVar1 * auVar5 + auVar7;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = auVar7._8_8_;
  uVar16 = SUB168(auVar3 * ZEXT816(0x20c49ba5e353f7cf),8) >> 7;
  uVar12 = auVar7._8_4_ + (int)uVar16 * -1000;
  uVar14 = (uint)(local_40.hi_ >> (~(byte)iVar13 & 0x3f));
  if (uVar12 < uVar14) {
    if ((uVar12 != 0) || ((auVar7._0_8_ != 0 || ((uVar11 & 1) == 0)))) {
LAB_001da70f:
      if (uVar16 == 0) {
        assert_fail("/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/build_O3/_deps/fmt-src/include/fmt/format-inl.h"
                    ,0x497,"");
      }
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar16;
      if (SUB168(auVar4 * ZEXT816(0xabcc77118461cefd),0) < 0xabcc77118461cefd &&
          (auVar4 * ZEXT816(0xabcc77118461cefd) & (undefined1  [16])0x3ffffff) ==
          (undefined1  [16])0x0) {
        uVar16 = uVar16 / 100000000;
        if (uVar16 == 0) {
          assert_fail("/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/build_O3/_deps/fmt-src/include/fmt/format-inl.h"
                      ,0x482,"");
        }
        uVar12 = 8;
        for (uVar14 = (int)uVar16 * 0x40000000 | (uint)((int)uVar16 * -0x3d70a3d7) >> 2;
            uVar14 < 0x28f5c29; uVar14 = uVar14 * 0x40000000 | uVar14 * -0x3d70a3d7 >> 2) {
          uVar16 = (ulong)uVar14;
          uVar12 = uVar12 + 2;
        }
        uVar14 = (int)uVar16 * -0x33333333;
        uVar15 = uVar14 >> 1 | (uint)((uVar14 & 1) != 0) << 0x1f;
        uVar14 = (uint)(uVar15 < 0x1999999a);
        uVar10 = (ulong)uVar15;
        if (uVar15 >= 0x1999999a) {
          uVar10 = uVar16;
        }
      }
      else {
        uVar11 = uVar16 * -0x70a3d70a3d70a3d7 >> 2 | uVar16 << 0x3e;
        uVar12 = 0;
        if (uVar11 < 0x28f5c28f5c28f5d) {
          uVar12 = 0;
          do {
            uVar16 = uVar11;
            uVar12 = uVar12 + 2;
            uVar11 = uVar16 * -0x70a3d70a3d70a3d7 >> 2 | uVar16 << 0x3e;
          } while (uVar11 < 0x28f5c28f5c28f5d);
        }
        uVar10 = uVar16 * -0x3333333333333333 >> 1 | uVar16 << 0x3f;
        uVar14 = (uint)(uVar10 < 0x199999999999999a);
        if (uVar10 >= 0x199999999999999a) {
          uVar10 = uVar16;
        }
      }
      iVar9 = iVar9 + 1 + (uVar14 | uVar12);
      goto LAB_001da890;
    }
    uVar16 = uVar16 - 1;
    uVar12 = 1000;
  }
  else if ((uVar12 <= uVar14) &&
          (cVar8 = cache_accessor<double>::compute_mul_parity(uVar11 * 2 - 1,&local_40,iVar13),
          (~(uint)uVar11 & (uint)((ushort)cVar8 >> 8) & 1) != 0 || ((ushort)cVar8 & 1) != 0))
  goto LAB_001da70f;
  uVar12 = uVar12 - (uVar14 >> 1);
  uVar14 = uVar12 + 0x32;
  if (1000 < uVar14) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/build_O3/_deps/fmt-src/include/fmt/format-inl.h"
                ,0xed,"n is too large");
  }
  uVar14 = uVar14 * 0x290;
  uVar15 = uVar14 >> 0x10;
  uVar10 = (ulong)uVar15 + uVar16 * 10;
  if ((uVar14 & 0xffff) < 0x290) {
    cVar8 = cache_accessor<double>::compute_mul_parity(uVar11 * 2,&local_40,iVar13);
    if ((uVar12 & 1) == ((ushort)cVar8 & 1)) {
      uVar10 = uVar10 + (long)(int)-(uVar15 & (ushort)cVar8 >> 8 & 1);
    }
    else {
      uVar10 = uVar10 - 1;
    }
  }
LAB_001da890:
  dVar17.exponent = iVar9;
  dVar17.significand = uVar10;
  dVar17._12_4_ = 0;
  return dVar17;
}

Assistant:

auto to_decimal(T x) noexcept -> decimal_fp<T> {
  // Step 1: integer promotion & Schubfach multiplier calculation.

  using carrier_uint = typename float_info<T>::carrier_uint;
  using cache_entry_type = typename cache_accessor<T>::cache_entry_type;
  auto br = bit_cast<carrier_uint>(x);

  // Extract significand bits and exponent bits.
  const carrier_uint significand_mask =
      (static_cast<carrier_uint>(1) << num_significand_bits<T>()) - 1;
  carrier_uint significand = (br & significand_mask);
  int exponent =
      static_cast<int>((br & exponent_mask<T>()) >> num_significand_bits<T>());

  if (exponent != 0) {  // Check if normal.
    exponent -= exponent_bias<T>() + num_significand_bits<T>();

    // Shorter interval case; proceed like Schubfach.
    // In fact, when exponent == 1 and significand == 0, the interval is
    // regular. However, it can be shown that the end-results are anyway same.
    if (significand == 0) return shorter_interval_case<T>(exponent);

    significand |= (static_cast<carrier_uint>(1) << num_significand_bits<T>());
  } else {
    // Subnormal case; the interval is always regular.
    if (significand == 0) return {0, 0};
    exponent =
        std::numeric_limits<T>::min_exponent - num_significand_bits<T>() - 1;
  }

  const bool include_left_endpoint = (significand % 2 == 0);
  const bool include_right_endpoint = include_left_endpoint;

  // Compute k and beta.
  const int minus_k = floor_log10_pow2(exponent) - float_info<T>::kappa;
  const cache_entry_type cache = cache_accessor<T>::get_cached_power(-minus_k);
  const int beta = exponent + floor_log2_pow10(-minus_k);

  // Compute zi and deltai.
  // 10^kappa <= deltai < 10^(kappa + 1)
  const uint32_t deltai = cache_accessor<T>::compute_delta(cache, beta);
  const carrier_uint two_fc = significand << 1;

  // For the case of binary32, the result of integer check is not correct for
  // 29711844 * 2^-82
  // = 6.1442653300000000008655037797566933477355632930994033813476... * 10^-18
  // and 29711844 * 2^-81
  // = 1.2288530660000000001731007559513386695471126586198806762695... * 10^-17,
  // and they are the unique counterexamples. However, since 29711844 is even,
  // this does not cause any problem for the endpoints calculations; it can only
  // cause a problem when we need to perform integer check for the center.
  // Fortunately, with these inputs, that branch is never executed, so we are
  // fine.
  const typename cache_accessor<T>::compute_mul_result z_mul =
      cache_accessor<T>::compute_mul((two_fc | 1) << beta, cache);

  // Step 2: Try larger divisor; remove trailing zeros if necessary.

  // Using an upper bound on zi, we might be able to optimize the division
  // better than the compiler; we are computing zi / big_divisor here.
  decimal_fp<T> ret_value;
  ret_value.significand = divide_by_10_to_kappa_plus_1(z_mul.result);
  uint32_t r = static_cast<uint32_t>(z_mul.result - float_info<T>::big_divisor *
                                                        ret_value.significand);

  if (r < deltai) {
    // Exclude the right endpoint if necessary.
    if (r == 0 && (z_mul.is_integer & !include_right_endpoint)) {
      --ret_value.significand;
      r = float_info<T>::big_divisor;
      goto small_divisor_case_label;
    }
  } else if (r > deltai) {
    goto small_divisor_case_label;
  } else {
    // r == deltai; compare fractional parts.
    const typename cache_accessor<T>::compute_mul_parity_result x_mul =
        cache_accessor<T>::compute_mul_parity(two_fc - 1, cache, beta);

    if (!(x_mul.parity | (x_mul.is_integer & include_left_endpoint)))
      goto small_divisor_case_label;
  }
  ret_value.exponent = minus_k + float_info<T>::kappa + 1;

  // We may need to remove trailing zeros.
  ret_value.exponent += remove_trailing_zeros(ret_value.significand);
  return ret_value;

  // Step 3: Find the significand with the smaller divisor.

small_divisor_case_label:
  ret_value.significand *= 10;
  ret_value.exponent = minus_k + float_info<T>::kappa;

  uint32_t dist = r - (deltai / 2) + (float_info<T>::small_divisor / 2);
  const bool approx_y_parity =
      ((dist ^ (float_info<T>::small_divisor / 2)) & 1) != 0;

  // Is dist divisible by 10^kappa?
  const bool divisible_by_small_divisor =
      check_divisibility_and_divide_by_pow10<float_info<T>::kappa>(dist);

  // Add dist / 10^kappa to the significand.
  ret_value.significand += dist;

  if (!divisible_by_small_divisor) return ret_value;

  // Check z^(f) >= epsilon^(f).
  // We have either yi == zi - epsiloni or yi == (zi - epsiloni) - 1,
  // where yi == zi - epsiloni if and only if z^(f) >= epsilon^(f).
  // Since there are only 2 possibilities, we only need to care about the
  // parity. Also, zi and r should have the same parity since the divisor
  // is an even number.
  const auto y_mul = cache_accessor<T>::compute_mul_parity(two_fc, cache, beta);

  // If z^(f) >= epsilon^(f), we might have a tie when z^(f) == epsilon^(f),
  // or equivalently, when y is an integer.
  if (y_mul.parity != approx_y_parity)
    --ret_value.significand;
  else if (y_mul.is_integer & (ret_value.significand % 2 != 0))
    --ret_value.significand;
  return ret_value;
}